

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O3

void __thiscall
Js::DictionaryTypeHandlerBase<int>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<int> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<int> **pdescriptor,Var value,
          PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar3;
  code *pcVar4;
  uint propertyId;
  bool bVar5;
  bool bVar6;
  Flags FVar7;
  int iVar8;
  BOOL BVar9;
  undefined4 *puVar10;
  UndeclaredBlockVariable *pUVar11;
  Var aValue;
  RecyclableObject *function;
  Flags FVar12;
  Var value_00;
  DictionaryPropertyDescriptor<int> *pDVar13;
  PropertyRecord *local_58;
  PropertyRecord *propertyRecord_local;
  int i;
  DictionaryTypeHandlerBase<int> *local_40;
  PropertyOperationFlags local_38;
  uint local_34;
  
  local_58 = propertyRecord;
  _i = value;
  local_40 = this;
  local_38 = flags;
  if ((pdescriptor == (DictionaryPropertyDescriptor<int> **)0x0) ||
     (pDVar13 = *pdescriptor, pDVar13 == (DictionaryPropertyDescriptor<int> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar5) goto LAB_00da6f29;
    *puVar10 = 0;
    pDVar13 = *pdescriptor;
  }
  local_34 = propertyRecord->pid;
  bVar5 = instance == (DynamicObject *)0x0;
  if (bVar5) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar6) goto LAB_00da6f29;
    *puVar10 = 0;
  }
  if (((pDVar13->Attributes & 8) != 0) && ((pDVar13->flags & IsShadowed) == None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar6) goto LAB_00da6f29;
    *puVar10 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar10 = 1;
    bVar6 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar6) goto LAB_00da6f29;
    *puVar10 = 0;
  }
  pRVar2 = (local_40->singletonInstance).ptr;
  if (pRVar2 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    if ((DynamicObject *)(pRVar2->super_RecyclerWeakReferenceBase).strongRef == instance) {
      bVar5 = true;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar10 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                  ,0x2ed,
                                  "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                  ,
                                  "this->singletonInstance == nullptr || localSingletonInstance == instance"
                                 );
      if (!bVar5) goto LAB_00da6f29;
      *puVar10 = 0;
      bVar5 = false;
    }
  }
  iVar8 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<true>(pDVar13);
  if (iVar8 == -1) {
    iVar8 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar13);
    value_00 = _i;
    if (iVar8 != -1) {
      iVar8 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar13);
      aValue = DynamicObject::GetSlot(instance,iVar8);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,value_00,(ScriptContext *)0x0);
      bVar5 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,&local_58,pdescriptor,
                         (int *)&propertyRecord_local);
      if (bVar5) {
        pDVar13 = *pdescriptor;
        iVar8 = DictionaryPropertyDescriptor<int>::GetDataPropertyIndex<false>(pDVar13);
        if (iVar8 == -1) {
          iVar8 = DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar13);
          if (iVar8 == -1) goto LAB_00da6e6a;
          DictionaryPropertyDescriptor<int>::GetSetterPropertyIndex(pDVar13);
        }
        if (info != (PropertyValueInfo *)0x0) {
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = 0xffff;
          info->m_attributes = '\0';
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<int> *)0x0;
      }
    }
    goto LAB_00da6e6a;
  }
  if ((-1 < (char)(undefined1)local_38) && (0x3f < pDVar13->Attributes)) {
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    pUVar11 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,iVar8);
    if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
        == pUVar11) {
      JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
    }
  }
  if ((pDVar13->flags & IsInitialized) == None) {
    if ((((local_38 & PropertyOperation_PreInit) == PropertyOperation_None) &&
        (pDVar13->flags = pDVar13->flags | IsInitialized, bVar5)) &&
       ((local_38 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
        PropertyOperation_None && 0xf < local_34)) {
      if (_i == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x305,"(value != nullptr)","value != nullptr");
        if (!bVar5) goto LAB_00da6f29;
        *puVar10 = 0;
      }
      BVar9 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
      if (BVar9 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar10 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar10 = 1;
        bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                    ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
        if (!bVar5) {
LAB_00da6f29:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar10 = 0;
      }
      bVar5 = VarIs<Js::JavascriptFunction>(_i);
      if (bVar5) {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixMethodPropsPhase);
        FVar12 = pDVar13->flags & ~IsFixed;
        if (bVar5) goto LAB_00da6f1c;
LAB_00da6f18:
        FVar7 = IsFixed;
      }
      else {
        bVar5 = Phases::IsEnabled((Phases *)&DAT_015a4e90,FixDataPropsPhase);
        if (bVar5) {
          FVar12 = pDVar13->flags & ~IsFixed;
        }
        else {
          bVar5 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_34,_i);
          FVar12 = pDVar13->flags & ~IsFixed;
          if (bVar5) goto LAB_00da6f18;
        }
LAB_00da6f1c:
        FVar7 = None;
      }
      pDVar13->flags = FVar12 | FVar7;
    }
  }
  else {
    InvalidateFixedField<int>(local_40,instance,local_34,pDVar13);
  }
  value_00 = _i;
  DynamicTypeHandler::SetSlotUnchecked(instance,iVar8,_i);
  if (info != (PropertyValueInfo *)0x0) {
    info->m_instance = &instance->super_RecyclableObject;
    info->m_propertyIndex = 0xffff;
    info->m_attributes = '\0';
    info->flags = InlineCacheNoFlags;
  }
LAB_00da6e6a:
  propertyId = local_34;
  bVar5 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_34);
  if ((bVar5) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    pJVar3 = (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary;
    Memory::Recycler::WBSetBit((char *)&propertyRecord_local);
    propertyRecord_local = (PropertyRecord *)&pJVar3->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&propertyRecord_local);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear
              ((PrototypeChainCache<Js::NoSpecialPropertyCache> *)propertyRecord_local);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,value_00,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }